

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall CMeshClosestPointMapper::SeamTool::Process(SeamTool *this)

{
  ON_MeshTopologyEdge *te;
  ON_MeshTopologyEdge *pOVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  Data *pDVar5;
  ON_MeshTopology *pOVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  ON_MeshTopologyFace *this_00;
  ulong uVar10;
  long lVar11;
  int j;
  long lVar12;
  int ofi;
  ON_RTree *local_100;
  long local_f8;
  ON_SimpleArray<int> seamedFis;
  ON_SimpleArray<int> seamlessFis;
  ON_Line seamLine;
  ON_BoundingBox local_90;
  ON_BoundingBox local_60;
  
  this->m_bHasSeams = false;
  iVar4 = ON_Mesh::FaceCount(this->m_mesh);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  uVar10 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar10 = SUB168(auVar2 * ZEXT816(0x18),0);
  }
  pDVar5 = (Data *)operator_new__(uVar10);
  this->m_faceData = pDVar5;
  local_100 = &this->m_seamTree;
  uVar10 = 0;
  do {
    iVar4 = ON_Mesh::FaceCount(this->m_mesh);
    if ((long)iVar4 <= (long)uVar10) {
      this->m_bProcessed = true;
      return;
    }
    ON_SimpleArray<int>::ON_SimpleArray(&seamedFis,4);
    ON_SimpleArray<int>::ON_SimpleArray(&seamlessFis,4);
    pOVar6 = ON_Mesh::Topology(this->m_mesh);
    this_00 = (pOVar6->m_topf).m_a + uVar10;
    bVar3 = ON_MeshTopologyFace::IsTriangle(this_00);
    local_f8 = 4 - (ulong)bVar3;
    for (lVar11 = 0; lVar11 != local_f8; lVar11 = lVar11 + 1) {
      pOVar6 = ON_Mesh::Topology(this->m_mesh);
      pOVar1 = (pOVar6->m_tope).m_a;
      te = pOVar1 + this_00->m_topei[lVar11];
      iVar4 = pOVar1[this_00->m_topei[lVar11]].m_topf_count;
      if (iVar4 == 2) {
        ofi = *te->m_topfi;
        if (uVar10 == (uint)ofi) {
          ofi = te->m_topfi[1];
        }
        bVar3 = TcContinuous(this->m_mesh,this->m_tc,te);
        if (bVar3) {
          ON_SimpleArray<int>::Append(&seamlessFis,&ofi);
        }
        else {
          ON_SimpleArray<int>::Append(&seamedFis,&ofi);
          pOVar6 = ON_Mesh::Topology(this->m_mesh);
          ON_MeshTopology::TopEdgeLine(&seamLine,pOVar6,this_00->m_topei[lVar11]);
          ON_Line::BoundingBox(&local_60,&seamLine);
          pdVar7 = ON_3dPoint::operator_cast_to_double_(&local_60.m_min);
          ON_Line::BoundingBox(&local_90,&seamLine);
          pdVar8 = ON_3dPoint::operator_cast_to_double_(&local_90.m_max);
          ON_RTree::Insert(local_100,pdVar7,pdVar8,this_00->m_topei[lVar11]);
          this->m_bHasSeams = true;
LAB_004fe33b:
          ON_Line::~ON_Line(&seamLine);
        }
      }
      else if (2 < iVar4) {
        pOVar6 = ON_Mesh::Topology(this->m_mesh);
        ON_MeshTopology::TopEdgeLine(&seamLine,pOVar6,this_00->m_topei[lVar11]);
        ON_Line::BoundingBox(&local_60,&seamLine);
        pdVar7 = ON_3dPoint::operator_cast_to_double_(&local_60.m_min);
        ON_Line::BoundingBox(&local_90,&seamLine);
        pdVar8 = ON_3dPoint::operator_cast_to_double_(&local_90.m_max);
        ON_RTree::Insert(local_100,pdVar7,pdVar8,this_00->m_topei[lVar11]);
        lVar9 = 0;
        for (lVar12 = 0; lVar12 < te->m_topf_count; lVar12 = lVar12 + 1) {
          if (uVar10 != *(uint *)((long)te->m_topfi + lVar9)) {
            ON_SimpleArray<int>::Append(&seamedFis,(int *)((long)te->m_topfi + lVar9));
            this->m_bHasSeams = true;
          }
          lVar9 = lVar9 + 4;
        }
        goto LAB_004fe33b;
      }
    }
    Data::Set(this->m_faceData + uVar10,&seamlessFis,&seamedFis);
    ON_SimpleArray<int>::~ON_SimpleArray(&seamlessFis);
    ON_SimpleArray<int>::~ON_SimpleArray(&seamedFis);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void Process() const
    {
      m_bHasSeams = false;
      m_faceData = new Data[m_mesh.FaceCount()];
      for (int fi = 0; fi < m_mesh.FaceCount(); fi++)
      {
        ON_SimpleArray<int> seamedFis(4);
        ON_SimpleArray<int> seamlessFis(4);
        const ON_MeshTopologyFace& tf = m_mesh.Topology().m_topf[fi];
        const int fec = tf.IsTriangle() ? 3 : 4;
        for (int i = 0; i < fec; i++)
        {
          const ON_MeshTopologyEdge& te = m_mesh.Topology().m_tope[tf.m_topei[i]];
          if (te.m_topf_count == 2)
          {
            const int ofi = te.m_topfi[0] == fi ? te.m_topfi[1] : te.m_topfi[0];
            if (TcContinuous(m_mesh, m_tc, te))
            {
              seamlessFis.Append(ofi);
            }
            else
            {
              seamedFis.Append(ofi);
              const ON_Line seamLine = m_mesh.Topology().TopEdgeLine(tf.m_topei[i]);
              m_seamTree.Insert(seamLine.BoundingBox().m_min, seamLine.BoundingBox().m_max, tf.m_topei[i]);
              m_bHasSeams = true;
            }
          }
          else if (te.m_topf_count > 2)
          {
            const ON_Line seamLine = m_mesh.Topology().TopEdgeLine(tf.m_topei[i]);
            m_seamTree.Insert(seamLine.BoundingBox().m_min, seamLine.BoundingBox().m_max, tf.m_topei[i]);
            for (int j = 0; j < te.m_topf_count; j++)
            {
              if (te.m_topfi[j] != fi)
              {
                seamedFis.Append(te.m_topfi[j]);
                m_bHasSeams = true;
              }
            }
          }
        }
        m_faceData[fi].Set(seamlessFis, seamedFis);
      }
      m_bProcessed = true;
    }